

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::emit_jfif_app0(jpeg_encoder *this)

{
  undefined1 uVar1;
  int iVar2;
  undefined1 local_12;
  undefined1 local_11;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  
  emit_marker(this,0xe0);
  emit_word(this,0x10);
  local_12 = 0x4a;
  if (this->m_all_stream_writes_succeeded == false) {
LAB_001139ec:
    this->m_all_stream_writes_succeeded = false;
LAB_001139f3:
    this->m_all_stream_writes_succeeded = false;
LAB_001139fa:
    uVar1 = false;
  }
  else {
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_12,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    local_11 = 0x46;
    if (SUB41(iVar2,0) == false) goto LAB_001139ec;
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_11,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    local_10 = 0x49;
    if (SUB41(iVar2,0) == false) goto LAB_001139ec;
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_10,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    local_f = 0x46;
    if (SUB41(iVar2,0) == false) goto LAB_001139f3;
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_f,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    local_e = 0;
    if (SUB41(iVar2,0) == false) goto LAB_001139f3;
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_e,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    local_d = 1;
    if (SUB41(iVar2,0) == false) goto LAB_001139f3;
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_d,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    local_c = 1;
    if (SUB41(iVar2,0) == false) goto LAB_001139fa;
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_c,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    local_b = 0;
    if (SUB41(iVar2,0) == false) goto LAB_001139fa;
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_b,1);
    uVar1 = (undefined1)iVar2;
  }
  this->m_all_stream_writes_succeeded = (bool)uVar1;
  emit_word(this,1);
  emit_word(this,1);
  local_a = 0;
  if (this->m_all_stream_writes_succeeded != false) {
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_a,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
    local_9 = 0;
    if (SUB41(iVar2,0) != false) {
      iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_9,1);
      uVar1 = (undefined1)iVar2;
      goto LAB_00113a63;
    }
  }
  uVar1 = false;
LAB_00113a63:
  this->m_all_stream_writes_succeeded = (bool)uVar1;
  return;
}

Assistant:

void jpeg_encoder::emit_jfif_app0()
{
  emit_marker(M_APP0);
  emit_word(2 + 4 + 1 + 2 + 1 + 2 + 2 + 1 + 1);
  emit_byte(0x4A); emit_byte(0x46); emit_byte(0x49); emit_byte(0x46); /* Identifier: ASCII "JFIF" */
  emit_byte(0);
  emit_byte(1);      /* Major version */
  emit_byte(1);      /* Minor version */
  emit_byte(0);      /* Density unit */
  emit_word(1);
  emit_word(1);
  emit_byte(0);      /* No thumbnail image */
  emit_byte(0);
}